

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezc3d.cpp
# Opt level: O3

void __thiscall
ezc3d::c3d::frames(c3d *this,
                  vector<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_> *frames,
                  size_t firstFrameidx)

{
  long lVar1;
  ulong uVar2;
  size_t idx;
  ulong uVar3;
  pointer pFVar4;
  
  pFVar4 = (frames->super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  lVar1 = (long)(frames->
                super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pFVar4;
  if (lVar1 != 0) {
    uVar2 = (lVar1 >> 4) * -0x5555555555555555;
    lVar1 = 0;
    uVar3 = 0;
    do {
      idx = firstFrameidx + uVar3;
      if (firstFrameidx == 0xffffffffffffffff) {
        idx = 0xffffffffffffffff;
      }
      frame(this,(Frame *)((long)&(pFVar4->_points).
                                  super___shared_ptr<ezc3d::DataNS::Points3dNS::Points,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + lVar1),idx,uVar3 < uVar2 - 1 && uVar3 != 0);
      uVar3 = uVar3 + 1;
      pFVar4 = (frames->
               super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(frames->
                     super__Vector_base<ezc3d::DataNS::Frame,_std::allocator<ezc3d::DataNS::Frame>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 4) *
              -0x5555555555555555;
      lVar1 = lVar1 + 0x30;
    } while (uVar3 < uVar2);
  }
  return;
}

Assistant:

void ezc3d::c3d::frames(const std::vector<ezc3d::DataNS::Frame> frames,
                        size_t firstFrameidx) {

  for (size_t i = 0; i < frames.size(); i++) {
    // Only performs internal updates on the first and last frames
    bool skipInternalUpdates = i > 0 && i < frames.size() - 1;
    frame(frames[i], firstFrameidx == SIZE_MAX ? SIZE_MAX : firstFrameidx + i,
          skipInternalUpdates);
  }
}